

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint huffmanDecodeSymbol(LodePNGBitReader *reader,HuffmanTree *codetree)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint index2;
  unsigned_short value;
  unsigned_short l;
  unsigned_short code;
  HuffmanTree *codetree_local;
  LodePNGBitReader *reader_local;
  
  uVar3 = peekBits(reader,9);
  uVar2 = (ushort)codetree->table_len[(ushort)uVar3];
  uVar1 = codetree->table_value[(ushort)uVar3];
  if (uVar2 < 10) {
    advanceBits(reader,(ulong)uVar2);
  }
  else {
    advanceBits(reader,9);
    uVar3 = peekBits(reader,(ulong)(uVar2 - 9));
    advanceBits(reader,(ulong)(codetree->table_len[uVar1 + uVar3] - 9));
    uVar1 = codetree->table_value[uVar1 + uVar3];
  }
  reader_local._4_4_ = (uint)uVar1;
  return reader_local._4_4_;
}

Assistant:

static unsigned huffmanDecodeSymbol(LodePNGBitReader* reader, const HuffmanTree* codetree) {
  unsigned short code = peekBits(reader, FIRSTBITS);
  unsigned short l = codetree->table_len[code];
  unsigned short value = codetree->table_value[code];
  if(l <= FIRSTBITS) {
    advanceBits(reader, l);
    return value;
  } else {
    unsigned index2;
    advanceBits(reader, FIRSTBITS);
    index2 = value + peekBits(reader, l - FIRSTBITS);
    advanceBits(reader, codetree->table_len[index2] - FIRSTBITS);
    return codetree->table_value[index2];
  }
}